

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

DescriptorSetAllocation * __thiscall
Diligent::DescriptorSetAllocator::Allocate
          (DescriptorSetAllocation *__return_storage_ptr__,DescriptorSetAllocator *this,
          Uint64 CommandQueueMask,VkDescriptorSetLayout SetLayout,char *DebugName)

{
  undefined *puVar1;
  bool bVar2;
  VulkanLogicalDevice *LogicalDevice_00;
  reference pVVar3;
  undefined8 uVar4;
  reference pvVar5;
  VkDescriptorPool_T *pVVar6;
  Char *Message;
  undefined1 local_130 [8];
  string msg;
  VkDescriptorSet vkSet;
  DescriptorPoolWrapper *NewPool;
  undefined1 local_e8 [8];
  string _msg;
  iterator local_c0;
  VkDescriptorPool_T *local_a0;
  VkDescriptorPool vkPool;
  VkDescriptorSet vkSet_1;
  undefined1 local_70 [8];
  iterator it;
  VulkanLogicalDevice *LogicalDevice;
  lock_guard<std::mutex> Lock;
  char *DebugName_local;
  VkDescriptorSetLayout SetLayout_local;
  Uint64 CommandQueueMask_local;
  DescriptorSetAllocator *this_local;
  
  Lock._M_device = (mutex_type *)DebugName;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&LogicalDevice,&(this->super_DescriptorPoolManager).m_Mutex);
  LogicalDevice_00 =
       RenderDeviceVkImpl::GetLogicalDevice((this->super_DescriptorPoolManager).m_DeviceVkImpl);
  std::
  deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::begin((iterator *)local_70,&(this->super_DescriptorPoolManager).m_Pools);
  do {
    std::
    deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
    ::end((iterator *)&vkSet_1,&(this->super_DescriptorPoolManager).m_Pools);
    bVar2 = std::operator!=((_Self *)local_70,(_Self *)&vkSet_1);
    if (!bVar2) {
      FormatString<char[30]>((string *)local_e8,(char (*) [30])"Allocated new descriptor pool");
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(0,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_e8);
      DescriptorPoolManager::CreateDescriptorPool
                ((DescriptorPoolWrapper *)&NewPool,&this->super_DescriptorPoolManager,
                 "Descriptor pool");
      std::
      deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
      ::
      emplace_front<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
                ((deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
                  *)&(this->super_DescriptorPoolManager).m_Pools,
                 (VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>
                  *)&NewPool);
      VulkanUtilities::
      VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
      ~VulkanObjectWrapper
                ((VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>
                  *)&NewPool);
      pvVar5 = std::
               deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
               ::front(&(this->super_DescriptorPoolManager).m_Pools);
      pVVar6 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDescriptorPool_T_
                         ((VulkanObjectWrapper *)pvVar5);
      msg.field_2._8_8_ =
           AllocateDescriptorSet(LogicalDevice_00,pVVar6,SetLayout,(char *)Lock._M_device);
      if ((VkDescriptorSet)msg.field_2._8_8_ == (VkDescriptorSet)0x0) {
        FormatString<char[34]>
                  ((string *)local_130,(char (*) [34])"Failed to allocate descriptor set");
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
                   ,0xe7);
        std::__cxx11::string::~string((string *)local_130);
      }
      std::__atomic_base<int>::operator++
                ((__atomic_base<int> *)&(this->super_DescriptorPoolManager).field_0xc4);
      uVar4 = msg.field_2._8_8_;
      pVVar6 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDescriptorPool_T_
                         ((VulkanObjectWrapper *)pvVar5);
      DescriptorSetAllocation::DescriptorSetAllocation
                (__return_storage_ptr__,(VkDescriptorSet)uVar4,pVVar6,CommandQueueMask,this);
LAB_003a43df:
      _msg.field_2._12_4_ = 1;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&LogicalDevice);
      return __return_storage_ptr__;
    }
    pVVar3 = std::
             _Deque_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_&,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*>
             ::operator*((_Deque_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_&,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*>
                          *)local_70);
    pVVar6 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDescriptorPool_T_
                       ((VulkanObjectWrapper *)pVVar3);
    vkPool = (VkDescriptorPool)
             AllocateDescriptorSet(LogicalDevice_00,pVVar6,SetLayout,(char *)Lock._M_device);
    if (vkPool != (VkDescriptorPool)0x0) {
      pVVar3 = std::
               _Deque_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_&,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*>
               ::operator*((_Deque_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_&,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*>
                            *)local_70);
      local_a0 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDescriptorPool_T_
                           ((VulkanObjectWrapper *)pVVar3);
      std::
      deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
      ::begin(&local_c0,&(this->super_DescriptorPoolManager).m_Pools);
      bVar2 = std::operator!=((_Self *)local_70,&local_c0);
      if (bVar2) {
        pVVar3 = std::
                 _Deque_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_&,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*>
                 ::operator*((_Deque_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_&,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*>
                              *)local_70);
        pvVar5 = std::
                 deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                 ::front(&(this->super_DescriptorPoolManager).m_Pools);
        std::
        swap<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
                  (pVVar3,pvVar5);
      }
      std::__atomic_base<int>::operator++
                ((__atomic_base<int> *)&(this->super_DescriptorPoolManager).field_0xc4);
      DescriptorSetAllocation::DescriptorSetAllocation
                (__return_storage_ptr__,(VkDescriptorSet)vkPool,local_a0,CommandQueueMask,this);
      goto LAB_003a43df;
    }
    std::
    _Deque_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_&,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*>
    ::operator++((_Deque_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_&,_VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*>
                  *)local_70);
  } while( true );
}

Assistant:

DescriptorSetAllocation DescriptorSetAllocator::Allocate(Uint64 CommandQueueMask, VkDescriptorSetLayout SetLayout, const char* DebugName)
{
    // Descriptor pools are externally synchronized, meaning that the application must not allocate
    // and/or free descriptor sets from the same pool in multiple threads simultaneously (13.2.3)
    std::lock_guard<std::mutex> Lock{m_Mutex};

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_DeviceVkImpl.GetLogicalDevice();
    // Try all pools starting from the frontmost
    for (auto it = m_Pools.begin(); it != m_Pools.end(); ++it)
    {
        VkDescriptorSet vkSet = AllocateDescriptorSet(LogicalDevice, *it, SetLayout, DebugName);
        if (vkSet != VK_NULL_HANDLE)
        {
            VkDescriptorPool vkPool = *it;
            // Move the pool to the front
            if (it != m_Pools.begin())
            {
                std::swap(*it, m_Pools.front());
            }

#ifdef DILIGENT_DEVELOPMENT
            ++m_AllocatedSetCounter;
#endif
            return {vkSet, vkPool, CommandQueueMask, *this};
        }
    }

    // Failed to allocate descriptor from existing pools -> create a new one
    LOG_INFO_MESSAGE("Allocated new descriptor pool");
    m_Pools.emplace_front(CreateDescriptorPool("Descriptor pool"));

    VulkanUtilities::DescriptorPoolWrapper& NewPool = m_Pools.front();
    VkDescriptorSet                         vkSet   = AllocateDescriptorSet(LogicalDevice, NewPool, SetLayout, DebugName);
    DEV_CHECK_ERR(vkSet != VK_NULL_HANDLE, "Failed to allocate descriptor set");

#ifdef DILIGENT_DEVELOPMENT
    ++m_AllocatedSetCounter;
#endif

    return {vkSet, NewPool, CommandQueueMask, *this};
}